

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  Printer *pPVar1;
  int iVar2;
  string *psVar3;
  AlphaNum *a;
  string local_c0;
  AlphaNum local_a0;
  string local_70;
  undefined1 local_40 [8];
  string constant_name;
  FieldDescriptor *extension_field;
  int i;
  Generator *this_local;
  
  extension_field._4_4_ = 0;
  while( true ) {
    iVar2 = FileDescriptor::extension_count(this->file_);
    if (iVar2 <= extension_field._4_4_) break;
    constant_name.field_2._8_8_ = FileDescriptor::extension(this->file_,extension_field._4_4_);
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)constant_name.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   psVar3,"_FIELD_NUMBER");
    ToUpper((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    pPVar1 = this->printer_;
    iVar2 = FieldDescriptor::number((FieldDescriptor *)constant_name.field_2._8_8_);
    strings::AlphaNum::AlphaNum(&local_a0,iVar2);
    StrCat_abi_cxx11_(&local_70,(protobuf *)&local_a0,a);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (pPVar1,"$constant_name$ = $number$\n",(char (*) [14])0x78fa3a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [7])0x79279d,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pPVar1 = this->printer_;
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)constant_name.field_2._8_8_);
    anon_unknown_0::ResolveKeyword(&local_c0,psVar3);
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)constant_name.field_2._8_8_);
    io::Printer::Print<char[14],std::__cxx11::string,char[5],char[11],char[5],std::__cxx11::string>
              (pPVar1,"$resolved_name$ = $file$.extensions_by_name[\'$name$\']\n",
               (char (*) [14])"resolved_name",&local_c0,(char (*) [5])0x778421,
               (char (*) [11])"DESCRIPTOR",(char (*) [5])0x77db8d,psVar3);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_40);
    extension_field._4_4_ = extension_field._4_4_ + 1;
  }
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    std::string constant_name = extension_field.name() + "_FIELD_NUMBER";
    ToUpper(&constant_name);
    printer_->Print("$constant_name$ = $number$\n", "constant_name",
                    constant_name, "number",
                    StrCat(extension_field.number()));
    printer_->Print(
        "$resolved_name$ = "
        "$file$.extensions_by_name['$name$']\n",
        "resolved_name", ResolveKeyword(extension_field.name()), "file",
        kDescriptorKey, "name", extension_field.name());
  }
  printer_->Print("\n");
}